

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFixed64
               (int field_number,uint64 value,CodedOutputStream *output)

{
  CodedOutputStream *in_RDX;
  CodedOutputStream *in_RSI;
  int in_EDI;
  uint32 in_stack_ffffffffffffffbc;
  CodedOutputStream *value_00;
  
  value_00 = in_RDX;
  MakeTag(in_EDI,WIRETYPE_FIXED64);
  io::CodedOutputStream::WriteTag(in_RDX,in_stack_ffffffffffffffbc);
  io::CodedOutputStream::WriteLittleEndian64(in_RSI,(uint64)value_00);
  return;
}

Assistant:

void WireFormatLite::WriteFixed64(int field_number, uint64 value,
                                  io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteFixed64NoTag(value, output);
}